

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri_wrapper.hpp
# Opt level: O0

void __thiscall jsoncons::jsonschema::uri_wrapper::uri_wrapper(uri_wrapper *this,uri *uri)

{
  bool bVar1;
  uri *in_RDI;
  error_code ec;
  uri *in_stack_fffffffffffffeb8;
  string *this_00;
  uri *in_stack_fffffffffffffec0;
  uri *puVar2;
  error_code local_f0;
  string local_e0 [32];
  string_view local_c0 [2];
  error_code *in_stack_ffffffffffffff60;
  string_view_type *in_stack_ffffffffffffff68;
  
  puVar2 = in_RDI;
  jsoncons::uri::uri(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  std::__cxx11::string::string((string *)(puVar2 + 1));
  jsoncons::uri::uri(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  jsoncons::uri::operator=(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  jsoncons::uri::~uri((uri *)0x740805);
  local_c0[0] = jsoncons::uri::encoded_fragment(in_stack_fffffffffffffec0);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(local_c0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    *(undefined1 *)&in_RDI[1].scheme_part_.first = 0;
  }
  else {
    jsoncons::uri::fragment_abi_cxx11_(puVar2);
    puVar2 = in_RDI + 1;
    this_00 = local_e0;
    std::__cxx11::string::operator=((string *)puVar2,this_00);
    std::__cxx11::string::~string(this_00);
    std::error_code::error_code((error_code *)puVar2);
    std::__cxx11::string::operator_cast_to_basic_string_view((string *)puVar2);
    jsonpointer::basic_json_pointer<char>::parse
              (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    jsonpointer::basic_json_pointer<char>::~basic_json_pointer((basic_json_pointer<char> *)0x7408b9)
    ;
    bVar1 = std::error_code::operator_cast_to_bool(&local_f0);
    *(byte *)&in_RDI[1].scheme_part_.first = -bVar1 & 1;
  }
  return;
}

Assistant:

explicit uri_wrapper(const uri& uri)
            : uri_{uri}
        {
            uri_ = jsoncons::uri(uri);
            if (!uri_.encoded_fragment().empty())
            {
                identifier_ = uri_.fragment();
                std::error_code ec;
                jsonpointer::json_pointer::parse(identifier_, ec);
                has_plain_name_fragment_ = ec ? true : false;
            }
            else
            {
                has_plain_name_fragment_ = false;
            }
        }